

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall
cppcms::widgets::select_multiple::element::element(element *this,string *val,message *msg,bool sel)

{
  pointer pcVar1;
  undefined7 in_register_00000009;
  
  *(uint *)this = (*(uint *)this & 0xfffffff8) + (int)CONCAT71(in_register_00000009,sel) * 5 + 2;
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  pcVar1 = (val->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->id,pcVar1,pcVar1 + val->_M_string_length);
  (this->str_option)._M_dataplus._M_p = (pointer)&(this->str_option).field_2;
  (this->str_option)._M_string_length = 0;
  (this->str_option).field_2._M_local_buf[0] = '\0';
  booster::locale::basic_message<char>::basic_message(&this->tr_option,msg);
  return;
}

Assistant:

select_multiple::element::element(std::string const &val,locale::message const &msg,bool sel) :
	selected(sel),
	need_translation(1),
	original_select(sel),
	id(val),
	tr_option(msg)
{
}